

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::CComputeBase::Run<glcts::(anonymous_namespace)::test_api::GL>
          (CComputeBase *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  GLuint *buffers_00;
  GLuint *buffers_01;
  undefined1 auVar1 [16];
  int iVar2;
  GLuint GVar3;
  GLint GVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar6;
  long lVar7;
  runtime_error *this_01;
  size_type *psVar8;
  undefined1 *data;
  long lVar9;
  ulong uVar10;
  GLsizeiptr size;
  _func_int **extraout_RDX;
  _func_int **pp_Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int height;
  int width;
  CColorArray bufferTest;
  CElementArray elements;
  CColorArray bufferRef1;
  CColorArray colors;
  CColorArray coords;
  CColorArray bufferRef4;
  CColorArray bufferRef3;
  CColorArray bufferRef2;
  DrawElementsIndirectCommand indirectElements;
  DrawArraysIndirectCommand indirectArrays;
  DIResult result;
  GLuint local_448;
  GLuint local_444;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_440;
  string local_428;
  string local_408;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_3e8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_3d0;
  GLuint *local_3b8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_3b0;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_398;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_380;
  undefined1 local_368 [16];
  undefined4 local_358;
  undefined1 local_348 [16];
  undefined1 local_338 [384];
  undefined1 local_1b8 [4];
  undefined1 auStack_1b4 [12];
  long local_1a8;
  undefined4 local_1a0;
  undefined1 local_19c;
  long local_38;
  
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91bf,0,(GLint *)&local_444);
  glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91bf,1,(GLint *)&local_448);
  iVar2 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  if ((int)*(GLuint *)CONCAT44(extraout_var,iVar2) < (int)local_444) {
    local_444 = *(GLuint *)CONCAT44(extraout_var,iVar2);
  }
  iVar2 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  GVar3 = *(GLuint *)(CONCAT44(extraout_var_00,iVar2) + 4);
  if ((int)GVar3 < (int)local_448) {
    local_448 = GVar3;
  }
  glu::CallLogWrapper::glViewport(this_00,0,0,local_444,local_448);
  local_1b8 = (undefined1  [4])0x0;
  auStack_1b4._0_4_ = 0.0;
  auStack_1b4._4_4_ = 0.0;
  auStack_1b4._8_4_ = 0.0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_3d0,(long)(int)(local_448 * local_444),(value_type *)local_1b8,
             (allocator_type *)local_338);
  local_1b8 = (undefined1  [4])0x0;
  auStack_1b4._0_4_ = 0.0;
  auStack_1b4._4_4_ = 0.0;
  auStack_1b4._8_4_ = 0.0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_3e8,(long)(int)(local_448 * local_444),(value_type *)local_1b8,
             (allocator_type *)local_338);
  local_1a8 = 0x6e6f697372657623;
  local_1a0 = 0x30303420;
  auStack_1b4._4_4_ = 1.68156e-44;
  auStack_1b4._8_4_ = 0.0;
  _local_1b8 = &local_1a8;
  local_19c = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_1b8);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar8) {
    local_338._16_8_ = *psVar8;
    local_338._24_8_ = plVar6[3];
    local_338._0_8_ = local_338 + 0x10;
  }
  else {
    local_338._16_8_ = *psVar8;
    local_338._0_8_ = (size_type *)*plVar6;
  }
  local_338._8_8_ = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (_local_1b8 != &local_1a8) {
    operator_delete(_local_1b8,local_1a8 + 1);
  }
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,0x1af8059);
  local_1a8 = 0x6e6f697372657623;
  local_1a0 = 0x30303420;
  auStack_1b4._4_4_ = 1.68156e-44;
  auStack_1b4._8_4_ = 0.0;
  _local_1b8 = &local_1a8;
  local_19c = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_1b8);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_408.field_2._M_allocated_capacity = *psVar8;
    local_408.field_2._8_8_ = plVar6[3];
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  }
  else {
    local_408.field_2._M_allocated_capacity = *psVar8;
    local_408._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_408._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (_local_1b8 != &local_1a8) {
    operator_delete(_local_1b8,local_1a8 + 1);
  }
  GVar3 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,(string *)local_338,&local_428,&local_408,false);
  this->_program = GVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  glu::CallLogWrapper::glBindAttribLocation(this_00,this->_program,0,"in_coords");
  glu::CallLogWrapper::glBindAttribLocation(this_00,this->_program,1,"in_colors");
  glu::CallLogWrapper::glLinkProgram(this_00,this->_program);
  lVar7 = DrawIndirectBase::CheckProgram(&this->super_DrawIndirectBase,this->_program);
  if (lVar7 == 0) {
    lVar7 = -1;
  }
  else {
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    buffers = &this->_bufferCoords;
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,*buffers);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,
               (long)local_3d0.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_3d0.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,(void *)0x0,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    buffers_00 = &this->_bufferColors;
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers_00);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,*buffers_00);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,
               (long)local_3e8.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_3e8.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,(void *)0x0,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,1,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
    local_358 = 0;
    local_368 = (undefined1  [16])0x0;
    local_348 = (undefined1  [16])0x0;
    auVar1._12_4_ = 0;
    auVar1._0_12_ = auStack_1b4;
    _local_1b8 = (float  [4])(auVar1 << 0x20);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_428,
               (long)(int)(local_448 * local_444),(value_type_conflict4 *)local_1b8,
               (allocator_type *)local_338);
    auVar1 = _DAT_019f5ce0;
    if (local_428._M_string_length - (long)local_428._M_dataplus._M_p != 0) {
      lVar7 = (long)(local_428._M_string_length - (long)local_428._M_dataplus._M_p) >> 2;
      lVar7 = lVar7 + (ulong)(lVar7 == 0);
      lVar9 = lVar7 + -1;
      auVar12._8_4_ = (int)lVar9;
      auVar12._0_8_ = lVar9;
      auVar12._12_4_ = (int)((ulong)lVar9 >> 0x20);
      uVar10 = 0;
      auVar12 = auVar12 ^ _DAT_019f5ce0;
      auVar13 = _DAT_019fcc00;
      do {
        auVar14 = auVar13 ^ auVar1;
        if ((bool)(~(auVar14._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar14._0_4_ ||
                    auVar12._4_4_ < auVar14._4_4_) & 1)) {
          *(int *)(local_428._M_dataplus._M_p + uVar10 * 4) = (int)uVar10;
        }
        if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
            auVar14._12_4_ <= auVar12._12_4_) {
          *(int *)(local_428._M_dataplus._M_p + uVar10 * 4 + 4) = (int)uVar10 + 1;
        }
        uVar10 = uVar10 + 2;
        lVar9 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 2;
        auVar13._8_8_ = lVar9 + 2;
      } while ((lVar7 + 1U & 0xfffffffffffffffe) != uVar10);
    }
    buffers_01 = &this->_bufferIndirect;
    local_3b8 = buffers;
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers_01);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,*buffers_01);
    if (this->_drawFunc == DRAW_ARRAYS) {
      data = local_348;
      size = 0x10;
    }
    else {
      if (this->_drawFunc != DRAW_ELEMENTS) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Unknown draw function!");
        goto LAB_00b977a8;
      }
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_ebo);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->_ebo);
      glu::CallLogWrapper::glBufferData
                (this_00,0x8893,local_428._M_string_length - (long)local_428._M_dataplus._M_p,
                 local_428._M_dataplus._M_p,0x88e4);
      data = local_368;
      size = 0x14;
    }
    glu::CallLogWrapper::glBufferData(this_00,0x8f3f,size,data,0x88e4);
    local_1a8 = 0x6e6f697372657623;
    local_1a0 = 0x30333420;
    auStack_1b4._4_4_ = 1.68156e-44;
    auStack_1b4._8_4_ = 0.0;
    _local_1b8 = &local_1a8;
    local_19c = 0;
    plVar6 = (long *)std::__cxx11::string::append(local_1b8);
    psVar8 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar8) {
      local_338._16_8_ = *psVar8;
      local_338._24_8_ = plVar6[3];
      local_338._0_8_ = local_338 + 0x10;
    }
    else {
      local_338._16_8_ = *psVar8;
      local_338._0_8_ = (size_type *)*plVar6;
    }
    pp_Var11 = (_func_int **)plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_338._8_8_ = pp_Var11;
    if (_local_1b8 != &local_1a8) {
      operator_delete(_local_1b8,local_1a8 + 1);
      pp_Var11 = extraout_RDX;
    }
    GVar3 = DrawIndirectBase::CreateComputeProgram
                      (&this->super_DrawIndirectBase,(string *)local_338,SUB81(pp_Var11,0));
    this->_programCompute = GVar3;
    if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
      operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
      GVar3 = this->_programCompute;
    }
    glu::CallLogWrapper::glLinkProgram(this_00,GVar3);
    lVar7 = DrawIndirectBase::CheckProgram(&this->super_DrawIndirectBase,this->_programCompute);
    if (lVar7 == 0) {
      lVar7 = -1;
    }
    else {
      glu::CallLogWrapper::glUseProgram(this_00,this->_programCompute);
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->_programCompute,"width");
      glu::CallLogWrapper::glUniform1ui(this_00,GVar4,local_444);
      GVar4 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->_programCompute,"height");
      glu::CallLogWrapper::glUniform1ui(this_00,GVar4,local_448);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,*local_3b8);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,*buffers_00);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,2,*buffers_01);
      glu::CallLogWrapper::glDispatchCompute(this_00,local_444,local_448,1);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x2040);
      glu::CallLogWrapper::glUseProgram(this_00,this->_program);
      if (this->_drawFunc == DRAW_ELEMENTS) {
        glu::CallLogWrapper::glDrawElementsIndirect(this_00,0,0x1405,(void *)0x0);
      }
      else {
        if (this->_drawFunc != DRAW_ARRAYS) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"Unknown draw function!");
LAB_00b977a8:
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        glu::CallLogWrapper::glDrawArraysIndirect(this_00,0,(void *)0x0);
      }
      iVar5 = local_448 * local_444;
      iVar2 = iVar5 + 3;
      if (-1 < iVar5) {
        iVar2 = iVar5;
      }
      local_1b8[0] = false;
      stack0xfffffffffffffe49 = 0;
      auStack_1b4._4_8_ = (_func_int **)0x3f80000000000000;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &local_408,(long)(iVar2 >> 2),(value_type *)local_1b8,(allocator_type *)local_338);
      iVar5 = local_448 * local_444;
      iVar2 = iVar5 + 3;
      if (-1 < iVar5) {
        iVar2 = iVar5;
      }
      local_1b8[0] = false;
      stack0xfffffffffffffe49 = 0x3f0000;
      auStack_1b4._4_8_ = (_func_int **)0x3f80000000000000;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&local_380,(long)(iVar2 >> 2),(value_type *)local_1b8,(allocator_type *)local_338);
      iVar5 = local_448 * local_444;
      iVar2 = iVar5 + 3;
      if (-1 < iVar5) {
        iVar2 = iVar5;
      }
      local_1b8[0] = false;
      stack0xfffffffffffffe49 = 0x3f000000000000;
      auStack_1b4._4_8_ = (_func_int **)0x3f80000000000000;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&local_398,(long)(iVar2 >> 2),(value_type *)local_1b8,(allocator_type *)local_338);
      iVar5 = local_448 * local_444;
      iVar2 = iVar5 + 3;
      if (-1 < iVar5) {
        iVar2 = iVar5;
      }
      auStack_1b4._4_4_ = 0.0;
      auStack_1b4._8_4_ = 1.0;
      _local_1b8 = (long *)&DAT_3f0000003f000000;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&local_3b0,(long)(iVar2 >> 2),(value_type *)local_1b8,(allocator_type *)local_338);
      iVar5 = local_448 * local_444;
      iVar2 = iVar5 + 3;
      if (-1 < iVar5) {
        iVar2 = iVar5;
      }
      local_1b8 = (undefined1  [4])0x0;
      auStack_1b4._0_4_ = 0.0;
      auStack_1b4._4_4_ = 0.0;
      auStack_1b4._8_4_ = 0.0;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&local_440,(long)(iVar2 >> 2),(value_type *)local_1b8,(allocator_type *)local_338);
      auVar14[0xf] = 0;
      auVar14._0_15_ = stack0xfffffffffffffe49;
      _local_1b8 = (float  [4])(auVar14 << 8);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(auStack_1b4 + 4));
      local_38 = 0;
      glu::CallLogWrapper::glReadPixels
                (this_00,0,0,(int)local_444 / 2,(int)local_448 / 2,0x1908,0x1406,
                 local_440.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      lVar7 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)
                         ((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context
                         )->m_renderCtx,&local_440,(int)local_444 / 2,(int)local_448 / 2,
                         (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         &local_408,(int)local_444 / 2,(int)local_448 / 2);
      DIResult::sub_result((DILogger *)local_338,(DIResult *)local_1b8,lVar7);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)local_338,(char (*) [29])"Region 0 verification failed");
      DILogger::~DILogger((DILogger *)local_338);
      glu::CallLogWrapper::glReadPixels
                (this_00,(int)((local_444 - ((int)(local_444 + 1) >> 0x1f)) + 1) >> 1,0,
                 (int)local_444 / 2,(int)local_448 / 2,0x1908,0x1406,
                 local_440.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      lVar7 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)
                         ((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context
                         )->m_renderCtx,&local_440,(int)local_444 / 2,(int)local_448 / 2,&local_380,
                         (int)local_444 / 2,(int)local_448 / 2);
      DIResult::sub_result((DILogger *)local_338,(DIResult *)local_1b8,lVar7);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)local_338,(char (*) [29])"Region 1 verification failed");
      DILogger::~DILogger((DILogger *)local_338);
      glu::CallLogWrapper::glReadPixels
                (this_00,0,(int)((local_448 - ((int)(local_448 + 1) >> 0x1f)) + 1) >> 1,
                 (int)local_444 / 2,(int)local_448 / 2,0x1908,0x1406,
                 local_440.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      lVar7 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)
                         ((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context
                         )->m_renderCtx,&local_440,(int)local_444 / 2,(int)local_448 / 2,&local_398,
                         (int)local_444 / 2,(int)local_448 / 2);
      DIResult::sub_result((DILogger *)local_338,(DIResult *)local_1b8,lVar7);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)local_338,(char (*) [29])"Region 2 verification failed");
      DILogger::~DILogger((DILogger *)local_338);
      glu::CallLogWrapper::glReadPixels
                (this_00,(int)((local_444 - ((int)(local_444 + 1) >> 0x1f)) + 1) >> 1,
                 (int)((local_448 - ((int)(local_448 + 1) >> 0x1f)) + 1) >> 1,(int)local_444 / 2,
                 (int)local_448 / 2,0x1908,0x1406,
                 local_440.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      lVar7 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)
                         ((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context
                         )->m_renderCtx,&local_440,(int)local_444 / 2,(int)local_448 / 2,&local_3b0,
                         (int)local_444 / 2,(int)local_448 / 2);
      DIResult::sub_result((DILogger *)local_338,(DIResult *)local_1b8,lVar7);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)local_338,(char (*) [29])"Region 3 verification failed");
      DILogger::~DILogger((DILogger *)local_338);
      lVar7 = local_38;
      DILogger::~DILogger((DILogger *)local_1b8);
      if (local_440.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_440.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_440.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_440.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_3b0.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3b0.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_3b0.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_3b0.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_398.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_398.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_398.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_398.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_380.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_380.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_380.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_380.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_408._M_dataplus._M_p,
                        local_408.field_2._M_allocated_capacity - (long)local_408._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_428._M_dataplus._M_p,
                      local_428.field_2._M_allocated_capacity - (long)local_428._M_dataplus._M_p);
    }
  }
  if (local_3e8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3e8.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3e8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3d0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3d0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return lVar7;
}

Assistant:

long Run()
	{

		int width, height;
		glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 0, &width);
		glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 1, &height);

		width  = std::min(width, getWindowWidth());
		height = std::min(height, getWindowHeight());

		glViewport(0, 0, width, height);

		CColorArray coords(width * height, tcu::Vec4(0));
		CColorArray colors(width * height, tcu::Vec4(0));

		_program = CreateProgram(Vsh<api>(), "", Fsh<api>(), false);
		glBindAttribLocation(_program, 0, "in_coords");
		glBindAttribLocation(_program, 1, "in_colors");
		glLinkProgram(_program);
		if (!CheckProgram(_program))
		{
			return ERROR;
		}
		glUseProgram(_program);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_bufferCoords);
		glBindBuffer(GL_ARRAY_BUFFER, _bufferCoords);
		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), 0, GL_STREAM_DRAW);

		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), 0);
		glEnableVertexAttribArray(0);

		glGenBuffers(1, &_bufferColors);
		glBindBuffer(GL_ARRAY_BUFFER, _bufferColors);
		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(colors.size() * sizeof(colors[0])), 0, GL_STREAM_DRAW);

		glVertexAttribPointer(1, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), 0);
		glEnableVertexAttribArray(1);

		DrawElementsIndirectCommand indirectElements = { 0, 0, 0, 0, 0 };
		DrawArraysIndirectCommand   indirectArrays   = { 0, 0, 0, 0 };

		CElementArray elements(width * height, 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLuint>(i);
		}

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		switch (_drawFunc)
		{
		case DRAW_ARRAYS:
		{
			glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawArraysIndirectCommand), &indirectArrays, GL_STATIC_DRAW);
		}
		break;
		case DRAW_ELEMENTS:
		{
			glGenBuffers(1, &_ebo);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
						 GL_STATIC_DRAW);

			glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawElementsIndirectCommand), &indirectElements,
						 GL_STATIC_DRAW);
		}
		break;
		default:
			throw std::runtime_error("Unknown draw function!");
			break;
		}

		_programCompute = CreateComputeProgram(Csh<api>(), false);
		glLinkProgram(_programCompute);
		if (!CheckProgram(_programCompute))
		{
			return ERROR;
		}
		glUseProgram(_programCompute);
		glUniform1ui(glGetUniformLocation(_programCompute, "width"), width);
		glUniform1ui(glGetUniformLocation(_programCompute, "height"), height);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, _bufferCoords);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, _bufferColors);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, _bufferIndirect);

		glDispatchCompute(width, height, 1);
		glMemoryBarrier(GL_COMMAND_BARRIER_BIT | GL_SHADER_STORAGE_BARRIER_BIT);

		glUseProgram(_program);

		switch (_drawFunc)
		{
		case DRAW_ARRAYS:
		{
			glDrawArraysIndirect(GL_POINTS, 0);
		}
		break;
		case DRAW_ELEMENTS:
		{
			glDrawElementsIndirect(GL_POINTS, GL_UNSIGNED_INT, 0);
		}
		break;
		default:
			throw std::runtime_error("Unknown draw function!");
			break;
		}

		CColorArray bufferRef1(width * height / 4, tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
		CColorArray bufferRef2(width * height / 4, tcu::Vec4(0.5f, 0.0f, 0.0f, 1.0f));
		CColorArray bufferRef3(width * height / 4, tcu::Vec4(0.0f, 0.5f, 0.0f, 1.0f));
		CColorArray bufferRef4(width * height / 4, tcu::Vec4(0.5f, 0.5f, 0.0f, 1.0f));
		CColorArray bufferTest(width * height / 4, tcu::Vec4(0.0f));

		DIResult result;
		ReadPixelsFloat<api>(0, 0, width / 2, height / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, width / 2, height / 2, bufferRef1, width / 2, height / 2))
			<< "Region 0 verification failed";

		ReadPixelsFloat<api>((width + 1) / 2, 0, width / 2, height / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, width / 2, height / 2, bufferRef2, width / 2, height / 2))
			<< "Region 1 verification failed";

		ReadPixelsFloat<api>(0, (height + 1) / 2, width / 2, height / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, width / 2, height / 2, bufferRef3, width / 2, height / 2))
			<< "Region 2 verification failed";

		ReadPixelsFloat<api>((width + 1) / 2, (height + 1) / 2, width / 2, height / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, width / 2, height / 2, bufferRef4, width / 2, height / 2))
			<< "Region 3 verification failed";

		return result.code();
	}